

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile.cpp
# Opt level: O0

void __thiscall LogFile::Append(LogFile *this,char *data,size_t writeSize)

{
  pointer this_00;
  time_t tVar1;
  time_t nextStartTime;
  time_t nowTime;
  size_t writeSize_local;
  char *data_local;
  LogFile *this_local;
  
  if (0x4000000 - writeSize < this->m_writedSize) {
    RollFile(this);
  }
  this_00 = std::unique_ptr<WriteFile,_std::default_delete<WriteFile>_>::operator->
                      (&this->m_ptWriteFile);
  WriteFile::Append(this_00,data,writeSize);
  this->m_writedSize = writeSize + this->m_writedSize;
  this->m_cnt = this->m_cnt + 1;
  if (1000 < this->m_cnt) {
    tVar1 = time((time_t *)0x0);
    if (this->m_lastRollTime < (tVar1 / 0x15180) * 0x15180) {
      RollFile(this);
    }
    else if (3 < (ulong)(tVar1 - this->m_lastFlushTime)) {
      Flush(this);
      this->m_lastFlushTime = tVar1;
    }
    this->m_cnt = 0;
  }
  return;
}

Assistant:

void LogFile::Append(const char * data, size_t writeSize)
{
	// FIX ME if writeSize is larger than kRollFileSize, will cause wrong
	if (m_writedSize > kRollFileSize - writeSize)
	{
		//std::cout << "RollFile " << __FILE__ << " " << __LINE__ << " " << __func__ << " " << m_writedSize << " " << std::endl; 
		RollFile();
	}
	
	m_ptWriteFile->Append(data, writeSize);
	m_writedSize += writeSize;
	m_cnt += 1;
	
	//std::cout << __FILE__ << " " << __LINE__ << " " << __func__ << " " << m_cnt << " " << m_writedSize << std::endl; 
	
	if (kCheckNSteps < m_cnt)
	{
		time_t nowTime = time(NULL);
		time_t nextStartTime = nowTime / kRollPerSeconds * kRollPerSeconds;
		// next day shoule roll log file
		if (m_lastRollTime < nextStartTime)
		{
			//std::cout << "RollFile " << __FILE__ << " " << __LINE__ << " " << __func__ << " " << nowTime << " " << m_lastFlushTime << std::endl; 
			RollFile();
		}
		else if (kFlushInteralSeconds < nowTime - m_lastFlushTime)
		{
			//std::cout << "Flush " << __FILE__ << " " << __LINE__ << " " << __func__ << " " << nowTime << " " << m_lastFlushTime << std::endl; 
			Flush();
			m_lastFlushTime = nowTime;
		}
		
		m_cnt = 0;
	}
}